

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void teardown(void)

{
  string *psVar1;
  
  psVar1 = bob_pointer_abi_cxx11_;
  if (bob_pointer_abi_cxx11_ != (string *)0x0) {
    std::__cxx11::string::~string((string *)bob_pointer_abi_cxx11_);
    operator_delete(psVar1);
  }
  psVar1 = alice_pointer_abi_cxx11_;
  if (alice_pointer_abi_cxx11_ != (string *)0x0) {
    std::__cxx11::string::~string((string *)alice_pointer_abi_cxx11_);
    operator_delete(psVar1);
  }
  psVar1 = exception_pointer_abi_cxx11_;
  if (exception_pointer_abi_cxx11_ != (string *)0x0) {
    std::__cxx11::string::~string((string *)exception_pointer_abi_cxx11_);
    operator_delete(psVar1);
  }
  return;
}

Assistant:

void teardown(void) {
    delete bob_pointer;
    delete alice_pointer;
    delete exception_pointer;
}